

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O1

void __thiscall
cmMessenger::DisplayMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  cmListFileContext *pcVar7;
  ostream *poVar8;
  long *plVar9;
  cmListFileBacktrace *pcVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  long lVar12;
  char *pcVar13;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmMessageMetadata md;
  cmListFileContext lfc;
  ostringstream msg;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_268;
  string local_258;
  undefined1 local_238 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  long local_1f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1f0;
  bool local_1d0;
  element_type **local_1c8 [2];
  element_type *local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pcVar10 = backtrace;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (t < (DEPRECATION_WARNING|AUTHOR_ERROR)) {
    pcVar13 = &DAT_006f2e14 + *(int *)(&DAT_006f2e14 + (ulong)t * 4);
    pcVar10 = (cmListFileBacktrace *)&DAT_006f2e38;
    lVar12 = *(long *)(&DAT_006f2e38 + (ulong)t * 8);
  }
  else {
    lVar12 = 0xd;
    pcVar13 = "CMake Warning";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar12);
  PrintBacktraceTitle(this,(ostream *)local_1a8,backtrace);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":\n",2);
  cmDocumentationFormatter::cmDocumentationFormatter((cmDocumentationFormatter *)local_238);
  cmDocumentationFormatter::SetIndent((cmDocumentationFormatter *)local_238,"  ");
  cmDocumentationFormatter::PrintFormatted
            ((cmDocumentationFormatter *)local_238,(ostream *)local_1a8,(text->_M_dataplus)._M_p);
  cmDocumentationFormatter::~cmDocumentationFormatter((cmDocumentationFormatter *)local_238);
  local_268.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_268.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_268.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pcVar10 = (cmListFileBacktrace *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_268.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_268.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_268.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_268.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_268);
  iVar5 = (int)pcVar10;
  if (!bVar3) {
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238);
    uVar2 = local_238._8_8_;
    local_268.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_238._0_8_;
    _Var1._M_pi = local_268.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_238._0_8_ = (element_type *)0x0;
    local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_268.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    bVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_268);
    iVar5 = (int)pcVar10;
    if (!bVar3) {
      bVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_268);
      iVar5 = (int)pcVar10;
      if (!bVar3) {
        bVar3 = true;
        do {
          pcVar7 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top(&local_268);
          cmListFileContext::cmListFileContext((cmListFileContext *)local_238,pcVar7);
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (local_1f8 == -1)) {
            if (bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Call Stack (most recent call first):\n",0x25);
              bVar3 = false;
            }
            if ((this->TopSource).
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true) {
              cmSystemTools::RelativeIfUnder(&local_258,(string *)this,(string *)&local_218);
              std::__cxx11::string::operator=((string *)local_218._M_local_buf,(string *)&local_258)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
            poVar8 = operator<<((ostream *)local_1a8,(cmListFileContext *)local_238);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          }
          if ((local_1d0 == true) &&
             (local_1d0 = false,
             local_1f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1f0._M_value + 0x10)
             )) {
            operator_delete((void *)local_1f0._M_value._M_dataplus._M_p,local_1f0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_allocated_capacity != &local_208) {
            operator_delete((void *)local_218._M_allocated_capacity,
                            local_208._M_allocated_capacity + 1);
          }
          if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
            operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
          }
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238);
          uVar2 = local_238._8_8_;
          local_268.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_238._0_8_;
          _Var1._M_pi = local_268.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_238._0_8_ = (element_type *)0x0;
          local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_268.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
          if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
          }
          bVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_268);
          iVar5 = (int)pcVar10;
        } while (!bVar4);
      }
    }
  }
  if (local_268.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (t == AUTHOR_WARNING) {
    lVar12 = 0x45;
    pcVar13 = "This warning is for project developers.  Use -Wno-dev to suppress it.";
  }
  else {
    if (t != AUTHOR_ERROR) goto LAB_0023f290;
    lVar12 = 0x48;
    pcVar13 = "This error is for project developers. Use -Wno-error=dev to suppress it.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar12);
LAB_0023f290:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if (t == INTERNAL_ERROR) {
    cmsys::SystemInformation::GetProgramStack_abi_cxx11_
              ((string *)local_238,(SystemInformation *)0x0,0,iVar5);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_258._M_dataplus._M_p = (pointer)local_238._8_8_;
      local_258._M_string_length = local_238._0_8_;
      __str._M_str = "WARNING:";
      __str._M_len = 8;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_258,0,8,__str);
      if (iVar5 == 0) {
        std::__cxx11::string::substr((ulong)local_1c8,(ulong)local_238);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x6f2feb);
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar9 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar9 == p_Var11) {
          local_258.field_2._M_allocated_capacity = (size_type)p_Var11->_vptr__Sp_counted_base;
          local_258.field_2._8_8_ = plVar9[3];
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        }
        else {
          local_258.field_2._M_allocated_capacity = (size_type)p_Var11->_vptr__Sp_counted_base;
          local_258._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_258._M_string_length = plVar9[1];
        *plVar9 = (long)p_Var11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_238,(string *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],
                          (ulong)((long)&(local_1b8[0]->Value).Name._M_dataplus._M_p + 1));
        }
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_238._0_8_,local_238._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
    }
  }
  uVar6 = 0;
  if (t < LOG) {
    uVar6 = *(undefined4 *)(&DAT_006f2dfc + (ulong)t * 4);
  }
  local_258._M_string_length = CONCAT44((int)(local_258._M_string_length >> 0x20),uVar6);
  if ((t < DEPRECATION_WARNING) && ((0x8eU >> (t & 0x1f) & 1) != 0)) {
    cmSystemTools::s_ErrorOccurred = true;
    local_258._M_dataplus._M_p = "Error";
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)local_238,(cmMessageMetadata *)&local_258);
  }
  else {
    local_258._M_dataplus._M_p = "Warning";
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)local_238,(cmMessageMetadata *)&local_258);
  }
  if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmMessenger::DisplayMessage(MessageType t, const std::string& text,
                                 const cmListFileBacktrace& backtrace) const
{
  std::ostringstream msg;
  if (!printMessagePreamble(t, msg)) {
    return;
  }

  // Add the immediate context.
  this->PrintBacktraceTitle(msg, backtrace);

  printMessageText(msg, text);

  // Add the rest of the context.
  PrintCallStack(msg, backtrace, this->TopSource);

  displayMessage(t, msg);
}